

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)24>_> *
vkt::tessellation::makeCommandPool
          (Move<vk::Handle<(vk::HandleType)24>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,deUint32 queueFamilyIndex)

{
  VkCommandPoolCreateInfo info;
  VkCommandPoolCreateInfo local_20;
  
  local_20.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_20.pNext = (void *)0x0;
  local_20.flags = 2;
  local_20.queueFamilyIndex = queueFamilyIndex;
  ::vk::createCommandPool(__return_storage_ptr__,vk,device,&local_20,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkCommandPool> makeCommandPool (const DeviceInterface& vk, const VkDevice device, const deUint32 queueFamilyIndex)
{
	const VkCommandPoolCreateInfo info =
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,			// VkStructureType			sType;
		DE_NULL,											// const void*				pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,	// VkCommandPoolCreateFlags	flags;
		queueFamilyIndex,									// deUint32					queueFamilyIndex;
	};
	return createCommandPool(vk, device, &info);
}